

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Cues::~Cues(Cues *this)

{
  long lVar1;
  long lVar2;
  CuePoint **ppCVar3;
  CuePoint *this_00;
  CuePoint **ppCVar4;
  CuePoint *pCP;
  CuePoint **q;
  CuePoint **p;
  long n;
  Cues *this_local;
  
  lVar1 = this->m_count;
  lVar2 = this->m_preload_count;
  ppCVar3 = this->m_cue_points;
  q = ppCVar3;
  while( true ) {
    if (q == ppCVar3 + lVar1 + lVar2) {
      if (this->m_cue_points != (CuePoint **)0x0) {
        operator_delete__(this->m_cue_points);
      }
      return;
    }
    ppCVar4 = q + 1;
    this_00 = *q;
    if (this_00 == (CuePoint *)0x0) break;
    q = ppCVar4;
    if (this_00 != (CuePoint *)0x0) {
      CuePoint::~CuePoint(this_00);
      operator_delete(this_00);
    }
  }
  __assert_fail("pCP",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x739,"mkvparser::Cues::~Cues()");
}

Assistant:

Cues::~Cues() {
  const long n = m_count + m_preload_count;

  CuePoint** p = m_cue_points;
  CuePoint** const q = p + n;

  while (p != q) {
    CuePoint* const pCP = *p++;
    assert(pCP);

    delete pCP;
  }

  delete[] m_cue_points;
}